

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O3

InterfacePortDef * __thiscall
kratos::InterfaceModPortDefinition::port
          (InterfacePortDef *__return_storage_ptr__,InterfaceModPortDefinition *this,string *name)

{
  element_type *peVar1;
  int iVar2;
  const_iterator cVar3;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  pointer local_58;
  size_type sStack_50;
  undefined1 local_40 [32];
  
  iVar2 = (**(this->super_IDefinition)._vptr_IDefinition)(this,name);
  if ((char)iVar2 != '\0') {
    peVar1 = (this->def_).
             super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2 = (**(peVar1->super_IDefinition)._vptr_IDefinition)(peVar1,name);
    if ((char)iVar2 == '\0') {
      peVar1 = (this->def_).
               super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar1->super_IDefinition)._vptr_IDefinition[3])(local_40,peVar1,name);
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->inputs_)._M_t,name);
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
      ).
      super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
      .super__Tuple_impl<2UL,_kratos::PortDirection,_kratos::PortType>.
      super__Tuple_impl<3UL,_kratos::PortType>.super__Head_base<3UL,_kratos::PortType,_false>.
      _M_head_impl = Data;
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
      ).
      super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
      .super__Tuple_impl<2UL,_kratos::PortDirection,_kratos::PortType>.
      super__Head_base<2UL,_kratos::PortDirection,_false>._M_head_impl =
           (uint)((_Rb_tree_header *)cVar3._M_node ==
                 &(this->inputs_)._M_t._M_impl.super__Rb_tree_header);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&(__return_storage_ptr__->
                  super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                  ).
                  super__Tuple_impl<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
                  .
                  super__Head_base<1UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_false>
                  ._M_head_impl,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_40 + 8));
      (__return_storage_ptr__->
      super__Tuple_impl<0UL,_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_kratos::PortDirection,_kratos::PortType>
      ).super__Head_base<0UL,_unsigned_int,_false>._M_head_impl = local_40._0_4_;
      if ((void *)local_40._8_8_ != (void *)0x0) {
        operator_delete((void *)local_40._8_8_,local_40._24_8_ - local_40._8_8_);
      }
    }
    else {
      peVar1 = (this->def_).
               super___shared_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar1->super_IDefinition)._vptr_IDefinition[2])(__return_storage_ptr__,peVar1,name);
    }
    return __return_storage_ptr__;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_58 = (name->_M_dataplus)._M_p;
  sStack_50 = name->_M_string_length;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x12;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_58;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)local_40,(detail *)"{0} does not exist",format_str,args);
  UserException::UserException(this_00,(string *)local_40);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

IDefinition::InterfacePortDef InterfaceModPortDefinition::port(const std::string& name) const {
    if (!has_port(name)) throw UserException(::format("{0} does not exist", name));
    if (def_->has_port(name)) {
        return def_->port(name);
    } else {
        // create a port def
        auto const& [width, size] = def_->var(name);
        auto port_dir =
            inputs_.find(name) != inputs_.end() ? PortDirection::In : PortDirection::Out;
        return std::make_tuple(width, size, port_dir, PortType::Data);
    }
}